

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O0

wchar_t uriDissectQueryMallocExMmA
                  (UriQueryListA **dest,wchar_t *itemCount,char *first,char *afterLast,
                  UriBool plusToSpace,UriBreakConversion breakConversion,UriMemoryManager *memory)

{
  UriBool UVar1;
  wchar_t *local_80;
  wchar_t *itemsAppended;
  UriQueryListStructA **ppUStack_68;
  wchar_t nullCounter;
  UriQueryListA **prevNext;
  char *valueAfter;
  char *valueFirst;
  char *keyAfter;
  char *keyFirst;
  char *walk;
  UriBreakConversion breakConversion_local;
  UriBool plusToSpace_local;
  char *afterLast_local;
  char *first_local;
  wchar_t *itemCount_local;
  UriQueryListA **dest_local;
  
  valueFirst = (char *)0x0;
  valueAfter = (char *)0x0;
  prevNext = (UriQueryListA **)0x0;
  local_80 = itemCount;
  if (itemCount == (wchar_t *)0x0) {
    local_80 = (wchar_t *)((long)&itemsAppended + 4);
  }
  if (((dest == (UriQueryListA **)0x0) || (first == (char *)0x0)) || (afterLast == (char *)0x0)) {
    dest_local._4_4_ = L'\x02';
  }
  else if (afterLast < first) {
    dest_local._4_4_ = L'\t';
  }
  else {
    ppUStack_68 = dest;
    keyAfter = first;
    keyFirst = first;
    walk._0_4_ = breakConversion;
    walk._4_4_ = plusToSpace;
    _breakConversion_local = afterLast;
    afterLast_local = first;
    first_local = (char *)itemCount;
    itemCount_local = (wchar_t *)dest;
    if (memory == (UriMemoryManager *)0x0) {
      memory = &defaultMemoryManager;
    }
    else {
      UVar1 = uriMemoryManagerIsComplete(memory);
      if (UVar1 != 1) {
        return L'\n';
      }
    }
    itemCount_local[0] = L'\0';
    itemCount_local[1] = L'\0';
    *local_80 = L'\0';
    for (; keyFirst < _breakConversion_local; keyFirst = keyFirst + 1) {
      if (*keyFirst == '&') {
        if (valueAfter == (char *)0x0) {
          valueFirst = keyFirst;
        }
        else {
          prevNext = (UriQueryListA **)keyFirst;
        }
        UVar1 = uriAppendQueryItemA(ppUStack_68,local_80,keyAfter,valueFirst,valueAfter,
                                    (char *)prevNext,walk._4_4_,(UriBreakConversion)walk,memory);
        if (UVar1 == 0) {
          *local_80 = L'\0';
          uriFreeQueryListMmA(*(UriQueryListA **)itemCount_local,memory);
          return L'\x03';
        }
        if ((ppUStack_68 != (UriQueryListStructA **)0x0) && (*ppUStack_68 != (UriQueryListA *)0x0))
        {
          ppUStack_68 = &(*ppUStack_68)->next;
        }
        if (keyFirst + 1 < _breakConversion_local) {
          keyAfter = keyFirst + 1;
        }
        else {
          keyAfter = (char *)0x0;
        }
        valueFirst = (char *)0x0;
        valueAfter = (char *)0x0;
        prevNext = (UriQueryListA **)0x0;
      }
      else if (((*keyFirst == '=') && (valueFirst == (char *)0x0)) &&
              (valueFirst = keyFirst, keyFirst + 1 <= _breakConversion_local)) {
        valueAfter = keyFirst + 1;
        prevNext = (UriQueryListA **)(keyFirst + 1);
      }
    }
    if (valueAfter == (char *)0x0) {
      valueFirst = keyFirst;
    }
    else {
      prevNext = (UriQueryListA **)keyFirst;
    }
    UVar1 = uriAppendQueryItemA(ppUStack_68,local_80,keyAfter,valueFirst,valueAfter,(char *)prevNext
                                ,walk._4_4_,(UriBreakConversion)walk,memory);
    if (UVar1 == 0) {
      *local_80 = L'\0';
      uriFreeQueryListMmA(*(UriQueryListA **)itemCount_local,memory);
      dest_local._4_4_ = L'\x03';
    }
    else {
      dest_local._4_4_ = L'\0';
    }
  }
  return dest_local._4_4_;
}

Assistant:

int URI_FUNC(DissectQueryMallocExMm)(URI_TYPE(QueryList) ** dest, int * itemCount,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		UriBool plusToSpace, UriBreakConversion breakConversion,
		UriMemoryManager * memory) {
	const URI_CHAR * walk = first;
	const URI_CHAR * keyFirst = first;
	const URI_CHAR * keyAfter = NULL;
	const URI_CHAR * valueFirst = NULL;
	const URI_CHAR * valueAfter = NULL;
	URI_TYPE(QueryList) ** prevNext = dest;
	int nullCounter;
	int * itemsAppended = (itemCount == NULL) ? &nullCounter : itemCount;

	if ((dest == NULL) || (first == NULL) || (afterLast == NULL)) {
		return URI_ERROR_NULL;
	}

	if (first > afterLast) {
		return URI_ERROR_RANGE_INVALID;
	}

	URI_CHECK_MEMORY_MANAGER(memory);  /* may return */

	*dest = NULL;
	*itemsAppended = 0;

	/* Parse query string */
	for (; walk < afterLast; walk++) {
		switch (*walk) {
		case _UT('&'):
			if (valueFirst != NULL) {
				valueAfter = walk;
			} else {
				keyAfter = walk;
			}

			if (URI_FUNC(AppendQueryItem)(prevNext, itemsAppended,
					keyFirst, keyAfter, valueFirst, valueAfter,
					plusToSpace, breakConversion, memory)
					== URI_FALSE) {
				/* Free list we built */
				*itemsAppended = 0;
				URI_FUNC(FreeQueryListMm)(*dest, memory);
				return URI_ERROR_MALLOC;
			}

			/* Make future items children of the current */
			if ((prevNext != NULL) && (*prevNext != NULL)) {
				prevNext = &((*prevNext)->next);
			}

			if (walk + 1 < afterLast) {
				keyFirst = walk + 1;
			} else {
				keyFirst = NULL;
			}
			keyAfter = NULL;
			valueFirst = NULL;
			valueAfter = NULL;
			break;

		case _UT('='):
			/* NOTE: WE treat the first '=' as a separator, */
			/*       all following go into the value part   */
			if (keyAfter == NULL) {
				keyAfter = walk;
				if (walk + 1 <= afterLast) {
					valueFirst = walk + 1;
					valueAfter = walk + 1;
				}
			}
			break;

		default:
			break;
		}
	}

	if (valueFirst != NULL) {
		/* Must be key/value pair */
		valueAfter = walk;
	} else {
		/* Must be key only */
		keyAfter = walk;
	}

	if (URI_FUNC(AppendQueryItem)(prevNext, itemsAppended, keyFirst, keyAfter,
			valueFirst, valueAfter, plusToSpace, breakConversion, memory)
			== URI_FALSE) {
		/* Free list we built */
		*itemsAppended = 0;
		URI_FUNC(FreeQueryListMm)(*dest, memory);
		return URI_ERROR_MALLOC;
	}

	return URI_SUCCESS;
}